

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DWARFDebugLine.cpp
# Opt level: O1

void __thiscall
llvm::DWARFDebugLine::Prologue::dump(Prologue *this,raw_ostream *OS,DIDumpOptions DumpOptions)

{
  char *pcVar1;
  long lVar2;
  DIDumpOptions DumpOpts;
  DIDumpOptions DumpOpts_00;
  DIDumpOptions DumpOpts_01;
  raw_ostream *prVar3;
  pointer pFVar4;
  DIDumpOptions *pDVar5;
  ulong uVar6;
  void *__buf;
  void *__buf_00;
  void *__buf_01;
  void *__buf_02;
  uint uVar7;
  _func_int **pp_Var8;
  uint uVar9;
  ulong uVar10;
  bool bVar11;
  StringRef SVar12;
  StringRef Str;
  StringRef Str_00;
  StringRef Str_01;
  format_object_base local_108;
  uint8_t local_f8;
  format_object_base local_f0;
  uint8_t local_e0;
  format_object_base local_d8;
  int8_t local_c8;
  format_object_base local_c0;
  uint8_t local_b0;
  format_object_base local_a8;
  uint8_t local_98;
  format_object_base local_90;
  uint16_t local_80;
  _func_int **local_78;
  _func_int **local_70;
  _func_int **local_68;
  undefined1 local_60 [16];
  _func_int *local_50;
  char *local_48;
  
  SVar12.Length = 0x15;
  SVar12.Data = "Line table prologue:\n";
  prVar3 = raw_ostream::operator<<(OS,SVar12);
  local_60._8_8_ = "    total_length: 0x%8.8lx\n";
  local_60._0_8_ = &PTR_home_01097f70;
  local_50 = (_func_int *)this->TotalLength;
  prVar3 = raw_ostream::operator<<(prVar3,(format_object_base *)local_60);
  local_80 = (this->FormParams).Version;
  local_90.Fmt = "         version: %u\n";
  local_90._vptr_format_object_base = (_func_int **)&PTR_home_01098078;
  raw_ostream::operator<<(prVar3,&local_90);
  if (4 < (this->FormParams).Version) {
    local_60._8_8_ = "    address_size: %u\n";
    local_60._0_8_ = &PTR_home_01098098;
    local_50 = (_func_int *)CONCAT71(local_50._1_7_,(this->FormParams).AddrSize);
    prVar3 = raw_ostream::operator<<(OS,(format_object_base *)local_60);
    local_90.Fmt = " seg_select_size: %u\n";
    local_90._vptr_format_object_base = (_func_int **)&PTR_home_01098098;
    local_80 = CONCAT11(local_80._1_1_,this->SegSelectorSize);
    raw_ostream::operator<<(prVar3,&local_90);
  }
  local_60._8_8_ = " prologue_length: 0x%8.8lx\n";
  local_70 = (_func_int **)&PTR_home_01097f70;
  local_60._0_8_ = &PTR_home_01097f70;
  local_50 = (_func_int *)this->PrologueLength;
  prVar3 = raw_ostream::operator<<(OS,(format_object_base *)local_60);
  local_90.Fmt = " min_inst_length: %u\n";
  local_90._vptr_format_object_base = (_func_int **)&PTR_home_01098098;
  local_80 = CONCAT11(local_80._1_1_,this->MinInstLength);
  prVar3 = raw_ostream::operator<<(prVar3,&local_90);
  local_108.Fmt = "";
  if (3 < (this->FormParams).Version) {
    local_108.Fmt = "max_ops_per_inst: %u\n";
  }
  local_108._vptr_format_object_base = (_func_int **)&PTR_home_01098098;
  local_f8 = this->MaxOpsPerInst;
  prVar3 = raw_ostream::operator<<(prVar3,&local_108);
  local_f0.Fmt = " default_is_stmt: %u\n";
  local_f0._vptr_format_object_base = (_func_int **)&PTR_home_01098098;
  local_e0 = this->DefaultIsStmt;
  prVar3 = raw_ostream::operator<<(prVar3,&local_f0);
  local_d8.Fmt = "       line_base: %i\n";
  local_d8._vptr_format_object_base = (_func_int **)&PTR_home_01098568;
  local_c8 = this->LineBase;
  prVar3 = raw_ostream::operator<<(prVar3,&local_d8);
  local_c0.Fmt = "      line_range: %u\n";
  local_c0._vptr_format_object_base = (_func_int **)&PTR_home_01098098;
  local_b0 = this->LineRange;
  prVar3 = raw_ostream::operator<<(prVar3,&local_c0);
  local_a8.Fmt = "     opcode_base: %u\n";
  local_a8._vptr_format_object_base = (_func_int **)&PTR_home_01098098;
  local_98 = this->OpcodeBase;
  raw_ostream::operator<<(prVar3,&local_a8);
  if ((this->StandardOpcodeLengths).
      super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_finish !=
      (this->StandardOpcodeLengths).
      super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_start) {
    uVar6 = 0;
    uVar10 = 1;
    do {
      SVar12 = dwarf::LNStandardString((uint)uVar10);
      local_48 = SVar12.Data;
      local_60._8_8_ = "standard_opcode_lengths[%s] = %u\n";
      local_60._0_8_ = &PTR_home_01098588;
      local_50 = (_func_int *)
                 CONCAT71(local_50._1_7_,
                          (this->StandardOpcodeLengths).
                          super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                          super__Vector_impl_data._M_start[uVar6]);
      raw_ostream::operator<<(OS,(format_object_base *)local_60);
      bVar11 = (long)(this->StandardOpcodeLengths).
                     super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                     super__Vector_impl_data._M_finish -
               (long)(this->StandardOpcodeLengths).
                     super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                     super__Vector_impl_data._M_start != uVar10;
      uVar6 = uVar10;
      uVar10 = (ulong)((uint)uVar10 + 1);
    } while (bVar11);
  }
  if (((this->IncludeDirectories).
       super__Vector_base<llvm::DWARFFormValue,_std::allocator<llvm::DWARFFormValue>_>._M_impl.
       super__Vector_impl_data._M_start !=
       (this->IncludeDirectories).
       super__Vector_base<llvm::DWARFFormValue,_std::allocator<llvm::DWARFFormValue>_>._M_impl.
       super__Vector_impl_data._M_finish) &&
     ((this->IncludeDirectories).
      super__Vector_base<llvm::DWARFFormValue,_std::allocator<llvm::DWARFFormValue>_>._M_impl.
      super__Vector_impl_data._M_finish !=
      (this->IncludeDirectories).
      super__Vector_base<llvm::DWARFFormValue,_std::allocator<llvm::DWARFFormValue>_>._M_impl.
      super__Vector_impl_data._M_start)) {
    uVar7 = (uint)((this->FormParams).Version < 5);
    uVar9 = 1;
    uVar6 = 0;
    local_68 = (_func_int **)&PTR_home_01097f50;
    do {
      local_60._8_8_ = "include_directories[%3u] = ";
      local_60._0_8_ = local_68;
      local_50 = (_func_int *)CONCAT44(local_50._4_4_,uVar7);
      raw_ostream::operator<<(OS,(format_object_base *)local_60);
      pDVar5 = &DumpOptions;
      DumpOpts.ParentRecurseDepth = DumpOptions.ParentRecurseDepth;
      DumpOpts.Version = DumpOptions.Version;
      DumpOpts.AddrSize = DumpOptions.AddrSize;
      DumpOpts.ShowAddresses = DumpOptions.ShowAddresses;
      DumpOpts.DumpType = DumpOptions.DumpType;
      DumpOpts.ChildRecurseDepth = DumpOptions.ChildRecurseDepth;
      DumpOpts.ShowChildren = DumpOptions.ShowChildren;
      DumpOpts.ShowParents = DumpOptions.ShowParents;
      DumpOpts.ShowForm = DumpOptions.ShowForm;
      DumpOpts.SummarizeTypes = DumpOptions.SummarizeTypes;
      DumpOpts.Verbose = DumpOptions.Verbose;
      DumpOpts.DisplayRawContents = DumpOptions.DisplayRawContents;
      DumpOpts._22_2_ = DumpOptions._22_2_;
      DWARFFormValue::dump
                ((this->IncludeDirectories).
                 super__Vector_base<llvm::DWARFFormValue,_std::allocator<llvm::DWARFFormValue>_>.
                 _M_impl.super__Vector_impl_data._M_start + uVar6,OS,DumpOpts);
      pcVar1 = OS->OutBufCur;
      if (pcVar1 < OS->OutBufEnd) {
        OS->OutBufCur = pcVar1 + 1;
        *pcVar1 = '\n';
      }
      else {
        raw_ostream::write(OS,10,__buf,(size_t)pDVar5);
      }
      uVar6 = (ulong)uVar9;
      uVar7 = uVar7 + 1;
      uVar9 = uVar9 + 1;
    } while (((long)(this->IncludeDirectories).
                    super__Vector_base<llvm::DWARFFormValue,_std::allocator<llvm::DWARFFormValue>_>.
                    _M_impl.super__Vector_impl_data._M_finish -
              (long)(this->IncludeDirectories).
                    super__Vector_base<llvm::DWARFFormValue,_std::allocator<llvm::DWARFFormValue>_>.
                    _M_impl.super__Vector_impl_data._M_start >> 4) * -0x5555555555555555 - uVar6 !=
             0);
  }
  if ((this->FileNames).
      super__Vector_base<llvm::DWARFDebugLine::FileNameEntry,_std::allocator<llvm::DWARFDebugLine::FileNameEntry>_>
      ._M_impl.super__Vector_impl_data._M_start !=
      (this->FileNames).
      super__Vector_base<llvm::DWARFDebugLine::FileNameEntry,_std::allocator<llvm::DWARFDebugLine::FileNameEntry>_>
      ._M_impl.super__Vector_impl_data._M_finish) {
    pFVar4 = (this->FileNames).
             super__Vector_base<llvm::DWARFDebugLine::FileNameEntry,_std::allocator<llvm::DWARFDebugLine::FileNameEntry>_>
             ._M_impl.super__Vector_impl_data._M_start;
    if ((this->FileNames).
        super__Vector_base<llvm::DWARFDebugLine::FileNameEntry,_std::allocator<llvm::DWARFDebugLine::FileNameEntry>_>
        ._M_impl.super__Vector_impl_data._M_finish != pFVar4) {
      uVar7 = (uint)((this->FormParams).Version < 5);
      local_78 = (_func_int **)&PTR_home_01097f50;
      uVar6 = 0;
      pp_Var8 = local_70;
      uVar10 = 1;
      do {
        pFVar4 = pFVar4 + uVar6;
        local_60._8_8_ = "file_names[%3u]:\n";
        local_60._0_8_ = local_78;
        local_68 = (_func_int **)CONCAT44(local_68._4_4_,uVar7);
        local_50 = (_func_int *)CONCAT44(local_50._4_4_,uVar7);
        raw_ostream::operator<<(OS,(format_object_base *)local_60);
        Str.Length = 0x11;
        Str.Data = "           name: ";
        raw_ostream::operator<<(OS,Str);
        pDVar5 = &DumpOptions;
        DumpOpts_00.ParentRecurseDepth = DumpOptions.ParentRecurseDepth;
        DumpOpts_00.Version = DumpOptions.Version;
        DumpOpts_00.AddrSize = DumpOptions.AddrSize;
        DumpOpts_00.ShowAddresses = DumpOptions.ShowAddresses;
        DumpOpts_00.DumpType = DumpOptions.DumpType;
        DumpOpts_00.ChildRecurseDepth = DumpOptions.ChildRecurseDepth;
        DumpOpts_00.ShowChildren = DumpOptions.ShowChildren;
        DumpOpts_00.ShowParents = DumpOptions.ShowParents;
        DumpOpts_00.ShowForm = DumpOptions.ShowForm;
        DumpOpts_00.SummarizeTypes = DumpOptions.SummarizeTypes;
        DumpOpts_00.Verbose = DumpOptions.Verbose;
        DumpOpts_00.DisplayRawContents = DumpOptions.DisplayRawContents;
        DumpOpts_00._22_2_ = DumpOptions._22_2_;
        DWARFFormValue::dump(&pFVar4->Name,OS,DumpOpts_00);
        pcVar1 = OS->OutBufCur;
        if (pcVar1 < OS->OutBufEnd) {
          pDVar5 = (DIDumpOptions *)(pcVar1 + 1);
          OS->OutBufCur = (char *)pDVar5;
          *pcVar1 = '\n';
          prVar3 = OS;
        }
        else {
          prVar3 = (raw_ostream *)raw_ostream::write(OS,10,__buf_00,(size_t)pDVar5);
        }
        local_60._8_8_ = "      dir_index: %lu\n";
        local_50 = (_func_int *)pFVar4->DirIdx;
        local_60._0_8_ = pp_Var8;
        raw_ostream::operator<<(prVar3,(format_object_base *)local_60);
        if ((this->ContentTypes).HasMD5 == true) {
          Str_00.Length = 0x11;
          Str_00.Data = "   md5_checksum: ";
          prVar3 = raw_ostream::operator<<(OS,Str_00);
          MD5::MD5Result::digest((SmallString<32U> *)local_60,&pFVar4->Checksum);
          prVar3 = (raw_ostream *)
                   raw_ostream::write(prVar3,(int)local_60._0_8_,
                                      (void *)(local_60._8_8_ & 0xffffffff),(size_t)pDVar5);
          pcVar1 = prVar3->OutBufCur;
          if (pcVar1 < prVar3->OutBufEnd) {
            prVar3->OutBufCur = pcVar1 + 1;
            *pcVar1 = '\n';
          }
          else {
            raw_ostream::write(prVar3,10,__buf_01,(size_t)pcVar1);
          }
          pp_Var8 = local_70;
          if ((_func_int **)local_60._0_8_ != &local_50) {
            free((void *)local_60._0_8_);
            pp_Var8 = local_70;
          }
        }
        if ((this->ContentTypes).HasModTime == true) {
          local_60._8_8_ = "       mod_time: 0x%8.8lx\n";
          local_50 = (_func_int *)pFVar4->ModTime;
          local_60._0_8_ = pp_Var8;
          raw_ostream::operator<<(OS,(format_object_base *)local_60);
        }
        if ((this->ContentTypes).HasLength == true) {
          local_60._8_8_ = "         length: 0x%8.8lx\n";
          local_50 = (_func_int *)pFVar4->Length;
          local_60._0_8_ = pp_Var8;
          raw_ostream::operator<<(OS,(format_object_base *)local_60);
        }
        if ((this->ContentTypes).HasSource == true) {
          Str_01.Length = 0x11;
          Str_01.Data = "         source: ";
          raw_ostream::operator<<(OS,Str_01);
          pDVar5 = &DumpOptions;
          DumpOpts_01.ParentRecurseDepth = DumpOptions.ParentRecurseDepth;
          DumpOpts_01.Version = DumpOptions.Version;
          DumpOpts_01.AddrSize = DumpOptions.AddrSize;
          DumpOpts_01.ShowAddresses = DumpOptions.ShowAddresses;
          DumpOpts_01.DumpType = DumpOptions.DumpType;
          DumpOpts_01.ChildRecurseDepth = DumpOptions.ChildRecurseDepth;
          DumpOpts_01.ShowChildren = DumpOptions.ShowChildren;
          DumpOpts_01.ShowParents = DumpOptions.ShowParents;
          DumpOpts_01.ShowForm = DumpOptions.ShowForm;
          DumpOpts_01.SummarizeTypes = DumpOptions.SummarizeTypes;
          DumpOpts_01.Verbose = DumpOptions.Verbose;
          DumpOpts_01.DisplayRawContents = DumpOptions.DisplayRawContents;
          DumpOpts_01._22_2_ = DumpOptions._22_2_;
          DWARFFormValue::dump(&pFVar4->Source,OS,DumpOpts_01);
          pcVar1 = OS->OutBufCur;
          if (pcVar1 < OS->OutBufEnd) {
            OS->OutBufCur = pcVar1 + 1;
            *pcVar1 = '\n';
          }
          else {
            raw_ostream::write(OS,10,__buf_02,(size_t)pDVar5);
          }
        }
        pFVar4 = (this->FileNames).
                 super__Vector_base<llvm::DWARFDebugLine::FileNameEntry,_std::allocator<llvm::DWARFDebugLine::FileNameEntry>_>
                 ._M_impl.super__Vector_impl_data._M_start;
        uVar7 = (int)local_68 + 1;
        lVar2 = ((long)(this->FileNames).
                       super__Vector_base<llvm::DWARFDebugLine::FileNameEntry,_std::allocator<llvm::DWARFDebugLine::FileNameEntry>_>
                       ._M_impl.super__Vector_impl_data._M_finish - (long)pFVar4 >> 3) *
                -0xf0f0f0f0f0f0f0f - uVar10;
        uVar6 = uVar10;
        uVar10 = (ulong)((int)uVar10 + 1);
      } while (lVar2 != 0);
    }
  }
  return;
}

Assistant:

void DWARFDebugLine::Prologue::dump(raw_ostream &OS,
                                    DIDumpOptions DumpOptions) const {
  OS << "Line table prologue:\n"
     << format("    total_length: 0x%8.8" PRIx64 "\n", TotalLength)
     << format("         version: %u\n", getVersion());
  if (getVersion() >= 5)
    OS << format("    address_size: %u\n", getAddressSize())
       << format(" seg_select_size: %u\n", SegSelectorSize);
  OS << format(" prologue_length: 0x%8.8" PRIx64 "\n", PrologueLength)
     << format(" min_inst_length: %u\n", MinInstLength)
     << format(getVersion() >= 4 ? "max_ops_per_inst: %u\n" : "", MaxOpsPerInst)
     << format(" default_is_stmt: %u\n", DefaultIsStmt)
     << format("       line_base: %i\n", LineBase)
     << format("      line_range: %u\n", LineRange)
     << format("     opcode_base: %u\n", OpcodeBase);

  for (uint32_t I = 0; I != StandardOpcodeLengths.size(); ++I)
    OS << format("standard_opcode_lengths[%s] = %u\n",
                 LNStandardString(I + 1).data(), StandardOpcodeLengths[I]);

  if (!IncludeDirectories.empty()) {
    // DWARF v5 starts directory indexes at 0.
    uint32_t DirBase = getVersion() >= 5 ? 0 : 1;
    for (uint32_t I = 0; I != IncludeDirectories.size(); ++I) {
      OS << format("include_directories[%3u] = ", I + DirBase);
      IncludeDirectories[I].dump(OS, DumpOptions);
      OS << '\n';
    }
  }

  if (!FileNames.empty()) {
    // DWARF v5 starts file indexes at 0.
    uint32_t FileBase = getVersion() >= 5 ? 0 : 1;
    for (uint32_t I = 0; I != FileNames.size(); ++I) {
      const FileNameEntry &FileEntry = FileNames[I];
      OS <<   format("file_names[%3u]:\n", I + FileBase);
      OS <<          "           name: ";
      FileEntry.Name.dump(OS, DumpOptions);
      OS << '\n'
         <<   format("      dir_index: %" PRIu64 "\n", FileEntry.DirIdx);
      if (ContentTypes.HasMD5)
        OS <<        "   md5_checksum: " << FileEntry.Checksum.digest() << '\n';
      if (ContentTypes.HasModTime)
        OS << format("       mod_time: 0x%8.8" PRIx64 "\n", FileEntry.ModTime);
      if (ContentTypes.HasLength)
        OS << format("         length: 0x%8.8" PRIx64 "\n", FileEntry.Length);
      if (ContentTypes.HasSource) {
        OS <<        "         source: ";
        FileEntry.Source.dump(OS, DumpOptions);
        OS << '\n';
      }
    }
  }
}